

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile_common.c
# Opt level: O2

void av1_get_tile_limits(AV1_COMMON *cm)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  int target;
  
  bVar3 = (byte)cm->seq_params->mib_size_log2;
  uVar4 = ~(-1 << (bVar3 & 0x1f));
  target = (int)((cm->mi_params).mi_cols + uVar4) >> (bVar3 & 0x1f);
  iVar5 = (int)(uVar4 + (cm->mi_params).mi_rows) >> (bVar3 & 0x1f);
  uVar4 = 0x1000 >> (bVar3 + 2 & 0x1f);
  (cm->tiles).max_width_sb = uVar4;
  iVar1 = tile_log2(uVar4,target);
  (cm->tiles).min_log2_cols = iVar1;
  iVar2 = 0x40;
  if (target < 0x40) {
    iVar2 = target;
  }
  iVar2 = tile_log2(1,iVar2);
  (cm->tiles).max_log2_cols = iVar2;
  iVar2 = 0x40;
  if (iVar5 < 0x40) {
    iVar2 = iVar5;
  }
  iVar2 = tile_log2(1,iVar2);
  (cm->tiles).max_log2_rows = iVar2;
  iVar2 = tile_log2(0x900000 >> (bVar3 * '\x02' + 4 & 0x1f),iVar5 * target);
  if (iVar1 < iVar2) {
    iVar1 = iVar2;
  }
  (cm->tiles).min_log2 = iVar1;
  return;
}

Assistant:

void av1_get_tile_limits(AV1_COMMON *const cm) {
  const SequenceHeader *const seq_params = cm->seq_params;
  CommonTileParams *const tiles = &cm->tiles;
  const int sb_cols =
      CEIL_POWER_OF_TWO(cm->mi_params.mi_cols, seq_params->mib_size_log2);
  const int sb_rows =
      CEIL_POWER_OF_TWO(cm->mi_params.mi_rows, seq_params->mib_size_log2);

  const int sb_size_log2 = seq_params->mib_size_log2 + MI_SIZE_LOG2;
  tiles->max_width_sb = MAX_TILE_WIDTH >> sb_size_log2;

#if CONFIG_CWG_C013
  bool use_level_7_above = false;
  for (int i = 0; i < seq_params->operating_points_cnt_minus_1 + 1; i++) {
    if (seq_params->seq_level_idx[i] >= SEQ_LEVEL_7_0 &&
        seq_params->seq_level_idx[i] <= SEQ_LEVEL_8_3) {
      // Currently it is assumed that levels 7.x and 8.x are either used for all
      // operating points, or none of them.
      if (i != 0 && !use_level_7_above) {
        aom_internal_error(cm->error, AOM_CODEC_UNSUP_BITSTREAM,
                           "Either all the operating points are levels 7.x or "
                           "8.x, or none of them are.");
      }
      use_level_7_above = true;
    }
  }
  const int max_tile_area_sb =
      (use_level_7_above ? MAX_TILE_AREA_LEVEL_7_AND_ABOVE : MAX_TILE_AREA) >>
      (2 * sb_size_log2);
#else
  const int max_tile_area_sb = MAX_TILE_AREA >> (2 * sb_size_log2);
#endif

  tiles->min_log2_cols = tile_log2(tiles->max_width_sb, sb_cols);
  tiles->max_log2_cols = tile_log2(1, AOMMIN(sb_cols, MAX_TILE_COLS));
  tiles->max_log2_rows = tile_log2(1, AOMMIN(sb_rows, MAX_TILE_ROWS));
  tiles->min_log2 = tile_log2(max_tile_area_sb, sb_cols * sb_rows);
  tiles->min_log2 = AOMMAX(tiles->min_log2, tiles->min_log2_cols);
}